

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.cc
# Opt level: O3

void __thiscall iqxmlrpc::Parser::Impl::~Impl(Impl *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  xmlFreeTextReader(this->reader);
  pcVar1 = (this->buf)._M_dataplus._M_p;
  paVar2 = &(this->buf).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Impl()
  {
    xmlFreeTextReader(reader);
  }